

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O0

void __thiscall
nvim::Nvim::async_buf_attach(Nvim *this,Buffer buffer,bool send_buffer,Dictionary *opts)

{
  allocator local_49;
  string local_48;
  Dictionary *local_28;
  Dictionary *opts_local;
  Buffer BStack_18;
  bool send_buffer_local;
  Buffer buffer_local;
  Nvim *this_local;
  
  local_28 = opts;
  opts_local._7_1_ = send_buffer;
  BStack_18 = buffer;
  buffer_local = (Buffer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"nvim_buf_attach",&local_49);
  NvimRPC::
  async_call<long,bool,std::multimap<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,std::less<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>,std::allocator<std::pair<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>const,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>>>>
            (&this->client_,&local_48,&stack0xffffffffffffffe8,(bool *)((long)&opts_local + 7),
             local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

void Nvim::async_buf_attach(Buffer buffer, bool send_buffer, const Dictionary& opts) {
    client_.async_call("nvim_buf_attach", buffer, send_buffer, opts);
}